

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall cbtQuantizedBvh::buildTree(cbtQuantizedBvh *this,int startIndex,int endIndex)

{
  cbtQuantizedBvhNode *pcVar1;
  cbtQuantizedBvhNode *pcVar2;
  cbtOptimizedBvhNode *pcVar3;
  cbtOptimizedBvhNode *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  unsigned_short uVar12;
  unsigned_short uVar13;
  unsigned_short uVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 in_ZMM0 [64];
  undefined1 auVar26 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar27;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  iVar21 = this->m_curNodeIndex;
  if (endIndex - startIndex == 1) {
    if (this->m_useQuantization == true) {
      pcVar1 = (this->m_quantizedLeafNodes).m_data + startIndex;
      uVar12 = pcVar1->m_quantizedAabbMin[1];
      uVar13 = pcVar1->m_quantizedAabbMin[2];
      uVar14 = pcVar1->m_quantizedAabbMax[0];
      uVar7 = *(undefined8 *)(pcVar1->m_quantizedAabbMax + 1);
      pcVar2 = (this->m_quantizedContiguousNodes).m_data + iVar21;
      pcVar2->m_quantizedAabbMin[0] = pcVar1->m_quantizedAabbMin[0];
      pcVar2->m_quantizedAabbMin[1] = uVar12;
      pcVar2->m_quantizedAabbMin[2] = uVar13;
      pcVar2->m_quantizedAabbMax[0] = uVar14;
      *(undefined8 *)(pcVar2->m_quantizedAabbMax + 1) = uVar7;
    }
    else {
      pcVar3 = (this->m_leafNodes).m_data + startIndex;
      uVar7 = *(undefined8 *)((pcVar3->m_aabbMinOrg).m_floats + 2);
      uVar8 = *(undefined8 *)(pcVar3->m_aabbMaxOrg).m_floats;
      uVar9 = *(undefined8 *)((pcVar3->m_aabbMaxOrg).m_floats + 2);
      iVar19 = pcVar3->m_escapeIndex;
      iVar20 = pcVar3->m_subPart;
      iVar23 = pcVar3->m_triangleIndex;
      cVar15 = pcVar3->m_padding[0];
      cVar16 = pcVar3->m_padding[1];
      cVar17 = pcVar3->m_padding[2];
      cVar18 = pcVar3->m_padding[3];
      uVar10 = *(undefined8 *)(pcVar3->m_padding + 4);
      uVar11 = *(undefined8 *)(pcVar3->m_padding + 0xc);
      pcVar4 = (this->m_contiguousNodes).m_data + iVar21;
      *(undefined8 *)(pcVar4->m_aabbMinOrg).m_floats =
           *(undefined8 *)(pcVar3->m_aabbMinOrg).m_floats;
      *(undefined8 *)((pcVar4->m_aabbMinOrg).m_floats + 2) = uVar7;
      *(undefined8 *)(pcVar4->m_aabbMaxOrg).m_floats = uVar8;
      *(undefined8 *)((pcVar4->m_aabbMaxOrg).m_floats + 2) = uVar9;
      pcVar4->m_escapeIndex = iVar19;
      pcVar4->m_subPart = iVar20;
      pcVar4->m_triangleIndex = iVar23;
      pcVar4->m_padding[0] = cVar15;
      pcVar4->m_padding[1] = cVar16;
      pcVar4->m_padding[2] = cVar17;
      pcVar4->m_padding[3] = cVar18;
      *(undefined8 *)(pcVar4->m_padding + 4) = uVar10;
      *(undefined8 *)(pcVar4->m_padding + 0xc) = uVar11;
    }
    this->m_curNodeIndex = this->m_curNodeIndex + 1;
  }
  else {
    iVar19 = calcSplittingAxis(this,startIndex,endIndex);
    iVar20 = sortAndCalcSplittingIndex(this,startIndex,endIndex,iVar19);
    iVar19 = this->m_curNodeIndex;
    setInternalNodeAabbMin(this,iVar19,&this->m_bvhAabbMax);
    setInternalNodeAabbMax(this,this->m_curNodeIndex,&this->m_bvhAabbMin);
    if (startIndex < endIndex) {
      iVar23 = startIndex;
      do {
        auVar26 = in_ZMM0._8_56_;
        iVar22 = this->m_curNodeIndex;
        cVar27 = getAabbMin(this,iVar23);
        auVar24._0_8_ = cVar27.m_floats._0_8_;
        auVar24._8_56_ = auVar26;
        auVar5._8_8_ = in_XMM1_Qb;
        auVar5._0_8_ = cVar27.m_floats._8_8_;
        local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24._0_16_,auVar5);
        auVar26 = ZEXT856(local_40.m_floats._8_8_);
        cVar27 = getAabbMax(this,iVar23);
        auVar25._0_8_ = cVar27.m_floats._0_8_;
        auVar25._8_56_ = auVar26;
        auVar6._8_8_ = in_XMM1_Qb;
        auVar6._0_8_ = cVar27.m_floats._8_8_;
        local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar25._0_16_,auVar6);
        in_ZMM0 = ZEXT1664((undefined1  [16])local_50.m_floats);
        mergeInternalNodeAabb(this,iVar22,&local_40,&local_50);
        iVar23 = iVar23 + 1;
      } while (endIndex != iVar23);
    }
    iVar22 = this->m_curNodeIndex + 1;
    this->m_curNodeIndex = iVar22;
    buildTree(this,startIndex,iVar20);
    iVar23 = this->m_curNodeIndex;
    buildTree(this,iVar20,endIndex);
    iVar21 = this->m_curNodeIndex - iVar21;
    if ((this->m_useQuantization == true) && (0x80 < iVar21)) {
      updateSubtreeHeaders(this,iVar22,iVar23);
    }
    if (this->m_useQuantization == true) {
      (this->m_quantizedContiguousNodes).m_data[iVar19].m_escapeIndexOrTriangleIndex = -iVar21;
    }
    else {
      (this->m_contiguousNodes).m_data[iVar19].m_escapeIndex = iVar21;
    }
  }
  return;
}

Assistant:

void cbtQuantizedBvh::buildTree(int startIndex, int endIndex)
{
#ifdef DEBUG_TREE_BUILDING
	gStackDepth++;
	if (gStackDepth > gMaxStackDepth)
		gMaxStackDepth = gStackDepth;
#endif  //DEBUG_TREE_BUILDING

	int splitAxis, splitIndex, i;
	int numIndices = endIndex - startIndex;
	int curIndex = m_curNodeIndex;

	cbtAssert(numIndices > 0);

	if (numIndices == 1)
	{
#ifdef DEBUG_TREE_BUILDING
		gStackDepth--;
#endif  //DEBUG_TREE_BUILDING

		assignInternalNodeFromLeafNode(m_curNodeIndex, startIndex);

		m_curNodeIndex++;
		return;
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.

	splitAxis = calcSplittingAxis(startIndex, endIndex);

	splitIndex = sortAndCalcSplittingIndex(startIndex, endIndex, splitAxis);

	int internalNodeIndex = m_curNodeIndex;

	//set the min aabb to 'inf' or a max value, and set the max aabb to a -inf/minimum value.
	//the aabb will be expanded during buildTree/mergeInternalNodeAabb with actual node values
	setInternalNodeAabbMin(m_curNodeIndex, m_bvhAabbMax);  //can't use cbtVector3(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY)) because of quantization
	setInternalNodeAabbMax(m_curNodeIndex, m_bvhAabbMin);  //can't use cbtVector3(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY)) because of quantization

	for (i = startIndex; i < endIndex; i++)
	{
		mergeInternalNodeAabb(m_curNodeIndex, getAabbMin(i), getAabbMax(i));
	}

	m_curNodeIndex++;

	//internalNode->m_escapeIndex;

	int leftChildNodexIndex = m_curNodeIndex;

	//build left child tree
	buildTree(startIndex, splitIndex);

	int rightChildNodexIndex = m_curNodeIndex;
	//build right child tree
	buildTree(splitIndex, endIndex);

#ifdef DEBUG_TREE_BUILDING
	gStackDepth--;
#endif  //DEBUG_TREE_BUILDING

	int escapeIndex = m_curNodeIndex - curIndex;

	if (m_useQuantization)
	{
		//escapeIndex is the number of nodes of this subtree
		const int sizeQuantizedNode = sizeof(cbtQuantizedBvhNode);
		const int treeSizeInBytes = escapeIndex * sizeQuantizedNode;
		if (treeSizeInBytes > MAX_SUBTREE_SIZE_IN_BYTES)
		{
			updateSubtreeHeaders(leftChildNodexIndex, rightChildNodexIndex);
		}
	}
	else
	{
	}

	setInternalNodeEscapeIndex(internalNodeIndex, escapeIndex);
}